

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

char * Abc_SopFromTruthHex(char *pTruth)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  Vec_Int_t *p;
  int *piVar4;
  char *pcVar5;
  char cVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  
  sVar3 = strlen(pTruth);
  uVar7 = 2;
  uVar8 = (uint)sVar3;
  if (1 < (int)uVar8) {
    uVar2 = uVar8 - 1;
    uVar15 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    uVar7 = 2;
    if (uVar2 != 0) {
      uVar7 = (ulong)((uVar15 ^ 0xffffffe0) + 0x23);
    }
  }
  if (1 << ((char)uVar7 - 2U & 0x1f) == uVar8) {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    piVar4 = (int *)malloc(400);
    p->pArray = piVar4;
    if (0 < (int)uVar8) {
      iVar14 = uVar8 * 4;
      uVar9 = 0;
      do {
        iVar14 = iVar14 + -4;
        cVar1 = pTruth[uVar9];
        cVar6 = -0x30;
        if (((9 < (byte)(cVar1 - 0x30U)) && (cVar6 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) &&
           (cVar6 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) {
          printf("String %s does not look like a hexadecimal representation of the truth table.\n",
                 pTruth);
          return (char *)0x0;
        }
        uVar15 = 0;
        do {
          if (((byte)(cVar1 + cVar6) >> (uVar15 & 0x1f) & 1) != 0) {
            Vec_IntPush(p,iVar14 + uVar15);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != 4);
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uVar8 & 0x7fffffff));
    }
    iVar14 = p->nSize;
    uVar8 = (int)uVar7 + 3;
    pcVar5 = (char *)malloc((long)(int)(iVar14 * uVar8 + 1));
    pcVar5[(int)(iVar14 * uVar8)] = '\0';
    if (0 < (long)iVar14) {
      piVar4 = p->pArray;
      uVar9 = 1;
      if (1 < (int)uVar7) {
        uVar9 = uVar7;
      }
      lVar10 = 0;
      pcVar11 = pcVar5;
      do {
        uVar15 = piVar4[lVar10];
        lVar12 = lVar10 * (ulong)uVar8;
        uVar13 = 0;
        do {
          pcVar11[uVar13] = (uVar15 >> ((uint)uVar13 & 0x1f) & 1) == 0 ^ 0x31;
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
        (pcVar5 + uVar7 + lVar12)[0] = ' ';
        (pcVar5 + uVar7 + lVar12)[1] = '1';
        pcVar5[uVar7 + lVar12 + 2] = '\n';
        lVar10 = lVar10 + 1;
        pcVar11 = pcVar11 + uVar8;
      } while (lVar10 != iVar14);
    }
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
  }
  else {
    pcVar5 = (char *)0x0;
    printf("String %s does not look like a truth table of a %d-variable function.\n",pTruth);
  }
  return pcVar5;
}

Assistant:

char * Abc_SopFromTruthHex( char * pTruth )
{
    char * pSopCover, * pCube;
    int nTruthSize, nVars, Digit, Length, Mint, i, b;
    Vec_Int_t * vMints;

    // get the number of variables
    nTruthSize = strlen(pTruth);
    nVars = (nTruthSize < 2) ? 2 : Abc_Base2Log(nTruthSize) + 2;
    if ( nTruthSize != (1 << (nVars-2)) )
    {
        printf( "String %s does not look like a truth table of a %d-variable function.\n", pTruth, nVars );
        return NULL;
    }

    // collect the on-set minterms
    vMints = Vec_IntAlloc( 100 );
    for ( i = 0; i < nTruthSize; i++ )
    {
        if ( pTruth[i] >= '0' && pTruth[i] <= '9' )
            Digit = pTruth[i] - '0';
        else if ( pTruth[i] >= 'a' && pTruth[i] <= 'f' )
            Digit = 10 + pTruth[i] - 'a';
        else if ( pTruth[i] >= 'A' && pTruth[i] <= 'F' )
            Digit = 10 + pTruth[i] - 'A';
        else
        {
            printf( "String %s does not look like a hexadecimal representation of the truth table.\n", pTruth );
            return NULL;
        }
        for ( b = 0; b < 4; b++ )
            if ( Digit & (1 << b) )
                Vec_IntPush( vMints, 4*(nTruthSize-1-i)+b );
    }

    // create the SOP representation of the minterms
    Length = Vec_IntSize(vMints) * (nVars + 3);
    pSopCover = ABC_ALLOC( char, Length + 1 );
    pSopCover[Length] = 0;
    Vec_IntForEachEntry( vMints, Mint, i )
    {
        pCube = pSopCover + i * (nVars + 3);
        for ( b = 0; b < nVars; b++ )
//            if ( Mint & (1 << (nVars-1-b)) )
            if ( Mint & (1 << b) )
                pCube[b] = '1';
            else
                pCube[b] = '0';
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
/*
    // create TT representation
    {
        extern void Bdc_ManDecomposeTest( unsigned uTruth, int nVars );
        unsigned uTruth = 0;
        int nVarsAll = 4;
        assert( nVarsAll == 4 );
        assert( nVars <= nVarsAll );
        Vec_IntForEachEntry( vMints, Mint, i )
            uTruth |= (1 << Mint);
//        uTruth = uTruth | (uTruth << 8) | (uTruth << 16) | (uTruth << 24);
        uTruth = uTruth | (uTruth << 16);
        Bdc_ManDecomposeTest( uTruth, nVarsAll );
    }
*/
    Vec_IntFree( vMints );
    return pSopCover;
}